

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O0

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::addFittestOffspring
          (GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  size_t index;
  bool bVar1;
  reference this_00;
  element_type *data;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference chromosome;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_90;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_88;
  const_iterator local_80;
  size_type local_78;
  size_t fittestChromosomeIndex;
  uint i;
  undefined1 local_60 [8];
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  localFittestChromosomes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> leastFittestIndicesList;
  Chromosome<Gen,_ComputeFitness> *c;
  iterator __end0;
  iterator __begin0;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *__range2;
  GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
  *this_local;
  
  __end0 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::begin(&this->_fittestChromosomes);
  c = (Chromosome<Gen,_ComputeFitness> *)
      std::
      vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
      ::end(&this->_fittestChromosomes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                                *)&c);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              ::operator*(&__end0);
    data = std::__shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>
                     );
    Chromosome<Gen,_ComputeFitness>::calculateFitness(this_00,data);
    __gnu_cxx::
    __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
    ::operator++(&__end0);
  }
  DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  ::findLeastFittestIndices
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &localFittestChromosomes.
              super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              *)this,&this->_population);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
            *)local_60,&this->_fittestChromosomes);
  fittestChromosomeIndex._0_4_ = 0;
  while( true ) {
    uVar2 = (ulong)(uint)fittestChromosomeIndex;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &localFittestChromosomes.
                        super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar3 <= uVar2) break;
    local_78 = findFittestOffspringIndex
                         (this,(vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                                *)local_60);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &localFittestChromosomes.
                         super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)(uint)fittestChromosomeIndex);
    index = *pvVar4;
    chromosome = std::
                 vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                 ::operator[]((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                               *)local_60,local_78);
    Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::setChromosome(&this->_population,index,chromosome);
    local_90._M_current =
         (Chromosome<Gen,_ComputeFitness> *)
         std::
         vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
         ::begin((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                  *)local_60);
    local_88 = __gnu_cxx::
               __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
               ::operator+(&local_90,local_78);
    __gnu_cxx::
    __normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>const*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>
    ::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*>
              ((__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>const*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>
                *)&local_80,&local_88);
    std::
    vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::erase((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             *)local_60,local_80);
    fittestChromosomeIndex._0_4_ = (uint)fittestChromosomeIndex + 1;
  }
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             *)local_60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &localFittestChromosomes.
              super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void addFittestOffspring()
    {
        //Update fitness values of offspring
        for (auto &c : _fittestChromosomes)
        {
            c.calculateFitness(_data.get());
        }

        //Get index of least fit individual
        auto leastFittestIndicesList = ReplacementPolicy::findLeastFittestIndices(_population);

        //Replace least fittest individual from most fittest offspring
        auto localFittestChromosomes = _fittestChromosomes;
        for (auto i = 0u; i < leastFittestIndicesList.size(); i++)
        {
            auto fittestChromosomeIndex = findFittestOffspringIndex(localFittestChromosomes);
            _population.setChromosome(leastFittestIndicesList[i], localFittestChromosomes[fittestChromosomeIndex]);
            localFittestChromosomes.erase(localFittestChromosomes.begin() + fittestChromosomeIndex);
        }
    }